

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaJsonWriter::ContinueString(VmaJsonWriter *this,char *pStr)

{
  char ch;
  size_t sVar1;
  size_t i;
  size_t sVar2;
  char *pStr_00;
  VmaStringBuilder *this_00;
  
  sVar1 = strlen(pStr);
  sVar2 = 0;
  do {
    if (sVar1 == sVar2) {
      return;
    }
    ch = pStr[sVar2];
    if (ch == '\"') {
      this_00 = this->m_SB;
      pStr_00 = "\\\"";
LAB_001a1f15:
      VmaStringBuilder::Add(this_00,pStr_00);
    }
    else {
      if (ch == '\\') {
        this_00 = this->m_SB;
        pStr_00 = "\\\\";
        goto LAB_001a1f15;
      }
      if (ch < ' ') {
        switch(ch) {
        case '\b':
          this_00 = this->m_SB;
          pStr_00 = "\\b";
          break;
        case '\t':
          this_00 = this->m_SB;
          pStr_00 = "\\t";
          break;
        case '\n':
          this_00 = this->m_SB;
          pStr_00 = "\\n";
          break;
        default:
          goto switchD_001a1f46_caseD_b;
        case '\f':
          this_00 = this->m_SB;
          pStr_00 = "\\f";
          break;
        case '\r':
          this_00 = this->m_SB;
          pStr_00 = "\\r";
        }
        goto LAB_001a1f15;
      }
      VmaStringBuilder::Add(this->m_SB,ch);
    }
switchD_001a1f46_caseD_b:
    sVar2 = sVar2 + 1;
  } while( true );
}

Assistant:

void VmaJsonWriter::ContinueString(const char* pStr)
{
    VMA_ASSERT(m_InsideString);

    const size_t strLen = strlen(pStr);
    for (size_t i = 0; i < strLen; ++i)
    {
        char ch = pStr[i];
        if (ch == '\\')
        {
            m_SB.Add("\\\\");
        }
        else if (ch == '"')
        {
            m_SB.Add("\\\"");
        }
        else if (ch >= 32)
        {
            m_SB.Add(ch);
        }
        else switch (ch)
        {
        case '\b':
            m_SB.Add("\\b");
            break;
        case '\f':
            m_SB.Add("\\f");
            break;
        case '\n':
            m_SB.Add("\\n");
            break;
        case '\r':
            m_SB.Add("\\r");
            break;
        case '\t':
            m_SB.Add("\\t");
            break;
        default:
            VMA_ASSERT(0 && "Character not currently supported.");
            break;
        }
    }
}